

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O3

Cba_Ntk_t * Cba_NtkAlloc(Cba_Man_t *p,int NameId,int nIns,int nOuts,int nObjs,int nFins,int nFons)

{
  Vec_Int_t *pVVar1;
  uint uVar2;
  Cba_Ntk_t *pCVar3;
  void **ppvVar4;
  int *piVar5;
  char *pcVar6;
  size_t sVar7;
  int iVar8;
  
  pCVar3 = (Cba_Ntk_t *)calloc(1,0x1b0);
  if ((nObjs | nFins | nOuts | nIns | nFons) < 0) {
    __assert_fail("nIns >= 0 && nOuts >= 0 && nObjs >= 0 && nFins >= 0 && nFons >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/cba/cba.h"
                  ,0x212,"Cba_Ntk_t *Cba_NtkAlloc(Cba_Man_t *, int, int, int, int, int, int)");
  }
  uVar2 = (p->vNtks).nSize;
  pCVar3->Id = uVar2;
  if (uVar2 == (p->vNtks).nCap) {
    if ((int)uVar2 < 0x10) {
      ppvVar4 = (p->vNtks).pArray;
      if (ppvVar4 == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(ppvVar4,0x80);
      }
      (p->vNtks).pArray = ppvVar4;
      (p->vNtks).nCap = 0x10;
    }
    else {
      ppvVar4 = (p->vNtks).pArray;
      if (ppvVar4 == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(ppvVar4,(ulong)uVar2 << 4);
      }
      (p->vNtks).pArray = ppvVar4;
      (p->vNtks).nCap = uVar2 * 2;
    }
  }
  else {
    ppvVar4 = (p->vNtks).pArray;
  }
  iVar8 = (p->vNtks).nSize;
  (p->vNtks).nSize = iVar8 + 1;
  ppvVar4[iVar8] = pCVar3;
  pCVar3->NameId = NameId;
  pCVar3->pDesign = p;
  if ((pCVar3->vInputs).nCap < nIns) {
    piVar5 = (pCVar3->vInputs).pArray;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc((long)nIns << 2);
    }
    else {
      piVar5 = (int *)realloc(piVar5,(long)nIns << 2);
    }
    (pCVar3->vInputs).pArray = piVar5;
    if (piVar5 == (int *)0x0) goto LAB_0034d72f;
    (pCVar3->vInputs).nCap = nIns;
  }
  if ((pCVar3->vOutputs).nCap < nOuts) {
    piVar5 = (pCVar3->vOutputs).pArray;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc((long)nOuts << 2);
    }
    else {
      piVar5 = (int *)realloc(piVar5,(long)nOuts << 2);
    }
    (pCVar3->vOutputs).pArray = piVar5;
    if (piVar5 == (int *)0x0) goto LAB_0034d72f;
    (pCVar3->vOutputs).nCap = nOuts;
  }
  iVar8 = (pCVar3->vObjType).nCap;
  if (iVar8 <= nObjs) {
    iVar8 = nObjs + 1;
    pcVar6 = (pCVar3->vObjType).pArray;
    if (pcVar6 == (char *)0x0) {
      pcVar6 = (char *)malloc((long)iVar8);
    }
    else {
      pcVar6 = (char *)realloc(pcVar6,(long)iVar8);
    }
    (pCVar3->vObjType).pArray = pcVar6;
    (pCVar3->vObjType).nCap = iVar8;
  }
  if ((pCVar3->vObjType).nSize == iVar8) {
    if (iVar8 < 0x10) {
      pcVar6 = (pCVar3->vObjType).pArray;
      if (pcVar6 == (char *)0x0) {
        pcVar6 = (char *)malloc(0x10);
      }
      else {
        pcVar6 = (char *)realloc(pcVar6,0x10);
      }
      (pCVar3->vObjType).pArray = pcVar6;
      (pCVar3->vObjType).nCap = 0x10;
    }
    else {
      uVar2 = iVar8 * 2;
      pcVar6 = (pCVar3->vObjType).pArray;
      if (pcVar6 == (char *)0x0) {
        pcVar6 = (char *)malloc((ulong)uVar2);
      }
      else {
        pcVar6 = (char *)realloc(pcVar6,(ulong)uVar2);
      }
      (pCVar3->vObjType).pArray = pcVar6;
      (pCVar3->vObjType).nCap = uVar2;
    }
  }
  else {
    pcVar6 = (pCVar3->vObjType).pArray;
  }
  iVar8 = (pCVar3->vObjType).nSize;
  (pCVar3->vObjType).nSize = iVar8 + 1;
  pcVar6[iVar8] = '\0';
  pVVar1 = &pCVar3->vObjFin0;
  iVar8 = nObjs + 2;
  if ((pCVar3->vObjFin0).nCap < iVar8) {
    piVar5 = (pCVar3->vObjFin0).pArray;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc((long)iVar8 << 2);
    }
    else {
      piVar5 = (int *)realloc(piVar5,(long)iVar8 << 2);
    }
    (pCVar3->vObjFin0).pArray = piVar5;
    if (piVar5 == (int *)0x0) goto LAB_0034d72f;
    pVVar1->nCap = iVar8;
  }
  Vec_IntPush(pVVar1,0);
  Vec_IntPush(pVVar1,1);
  pVVar1 = &pCVar3->vObjFon0;
  if ((pCVar3->vObjFon0).nCap < iVar8) {
    piVar5 = (pCVar3->vObjFon0).pArray;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc((long)iVar8 << 2);
    }
    else {
      piVar5 = (int *)realloc(piVar5,(long)iVar8 << 2);
    }
    (pCVar3->vObjFon0).pArray = piVar5;
    if (piVar5 == (int *)0x0) goto LAB_0034d72f;
    pVVar1->nCap = iVar8;
  }
  Vec_IntPush(pVVar1,0);
  Vec_IntPush(pVVar1,1);
  if ((pCVar3->vFinFon).nCap <= nFins) {
    piVar5 = (pCVar3->vFinFon).pArray;
    sVar7 = (long)(nFins + 1) << 2;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc(sVar7);
    }
    else {
      piVar5 = (int *)realloc(piVar5,sVar7);
    }
    (pCVar3->vFinFon).pArray = piVar5;
    if (piVar5 == (int *)0x0) goto LAB_0034d72f;
    (pCVar3->vFinFon).nCap = nFins + 1;
  }
  Vec_IntPush(&pCVar3->vFinFon,0);
  if ((pCVar3->vFonObj).nCap <= nFons) {
    piVar5 = (pCVar3->vFonObj).pArray;
    sVar7 = (long)(nFons + 1) << 2;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc(sVar7);
    }
    else {
      piVar5 = (int *)realloc(piVar5,sVar7);
    }
    (pCVar3->vFonObj).pArray = piVar5;
    if (piVar5 == (int *)0x0) {
LAB_0034d72f:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (pCVar3->vFonObj).nCap = nFons + 1;
  }
  Vec_IntPush(&pCVar3->vFonObj,0);
  return pCVar3;
}

Assistant:

static inline Cba_Ntk_t *  Cba_NtkAlloc( Cba_Man_t * p, int NameId, int nIns, int nOuts, int nObjs, int nFins, int nFons )
{    
    Cba_Ntk_t * pNew = ABC_CALLOC( Cba_Ntk_t, 1 );
    assert( nIns >= 0 && nOuts >= 0 && nObjs >= 0 && nFins >= 0 && nFons >= 0 );
    pNew->Id      = Vec_PtrSize(&p->vNtks);   Vec_PtrPush( &p->vNtks, pNew );
    pNew->NameId  = NameId;
    pNew->pDesign = p;
    Vec_IntGrow( &pNew->vInputs,  nIns );
    Vec_IntGrow( &pNew->vOutputs, nOuts );
    Vec_StrGrow( &pNew->vObjType, nObjs+1 );  Vec_StrPush( &pNew->vObjType,  (char)CBA_OBJ_NONE );
    Vec_IntGrow( &pNew->vObjFin0, nObjs+2 );  Vec_IntPush( &pNew->vObjFin0,  0 ); Vec_IntPush( &pNew->vObjFin0, 1 );
    Vec_IntGrow( &pNew->vObjFon0, nObjs+2 );  Vec_IntPush( &pNew->vObjFon0,  0 ); Vec_IntPush( &pNew->vObjFon0, 1 );
    Vec_IntGrow( &pNew->vFinFon,  nFins+1 );  Vec_IntPush( &pNew->vFinFon,   0 );
    Vec_IntGrow( &pNew->vFonObj,  nFons+1 );  Vec_IntPush( &pNew->vFonObj,   0 );
    return pNew;
}